

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O3

buffer_type *
rest_rpc::rpc_service::msgpack_codec::pack_args<person>
          (buffer_type *__return_storage_ptr__,person *args)

{
  size_t in_RCX;
  char d;
  undefined1 local_19;
  packer<msgpack::v1::sbuffer> local_18;
  
  msgpack::v1::sbuffer::sbuffer(__return_storage_ptr__,0x800);
  local_19 = 0x91;
  local_18.m_stream = __return_storage_ptr__;
  msgpack::v1::sbuffer::write(__return_storage_ptr__,(int)&local_19,(void *)0x1,in_RCX);
  person::msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>(args,&local_18);
  return __return_storage_ptr__;
}

Assistant:

static buffer_type pack_args(Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer, std::forward_as_tuple(std::forward<Args>(args)...));
    return buffer;
  }